

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

char * QTest::toString(char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RDI;
  char *msg;
  char *msg_1;
  undefined8 local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)operator_new__(1);
    *local_8 = '\0';
  }
  else {
    sVar1 = strlen(in_RDI);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    local_8 = (char *)qstrcpy(pcVar2,in_RDI);
  }
  return local_8;
}

Assistant:

char *QTest::toString(const char *str)
{
    if (!str) {
        char *msg = new char[1];
        *msg = '\0';
        return msg;
    }
    char *msg = new char[strlen(str) + 1];
    return qstrcpy(msg, str);
}